

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

string * utf8_to_gbk(string *__return_storage_ptr__,string *utf8)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  convert("UTF-8","GBK",(utf8->_M_dataplus)._M_p,utf8->_M_string_length,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string utf8_to_gbk(const std::string& utf8)
{
    std::string out;
    utf8_to_gbk(utf8, &out);
    return out;
}